

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall QAction::QAction(QAction *this,QActionPrivate *dd,QObject *parent)

{
  long lVar1;
  int *piVar2;
  QObject *pQVar3;
  long lVar4;
  
  QObject::QObject(&this->super_QObject,&dd->super_QObjectPrivate,parent);
  *(undefined ***)this = &PTR_metaObject_007dfd58;
  lVar1 = *(long *)&this->field_0x8;
  pQVar3 = (QObject *)QMetaObject::cast((QObject *)&QActionGroup::staticMetaObject);
  if (pQVar3 == (QObject *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar3);
  }
  piVar2 = *(int **)(lVar1 + 0x78);
  *(long *)(lVar1 + 0x78) = lVar4;
  *(QObject **)(lVar1 + 0x80) = pQVar3;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
    lVar4 = *(long *)(lVar1 + 0x78);
  }
  if (((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) &&
     (*(QActionGroup **)(lVar1 + 0x80) != (QActionGroup *)0x0)) {
    QActionGroup::addAction(*(QActionGroup **)(lVar1 + 0x80),this);
    return;
  }
  return;
}

Assistant:

QAction::QAction(QActionPrivate &dd, QObject *parent)
    : QObject(dd, parent)
{
    Q_D(QAction);
    d->group = qobject_cast<QActionGroup *>(parent);
    if (d->group)
        d->group->addAction(this);
}